

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

BranchInstr * __thiscall
Lowerer::InsertMissingItemCompareBranch
          (Lowerer *this,Opnd *compareSrc,OpCode opcode,LabelInstr *target,Instr *insertBeforeInstr)

{
  IRType IVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  Opnd *compareSrc1;
  undefined4 *puVar5;
  BranchInstr *pBVar6;
  char *this_00;
  
  this_00 = (char *)(ulong)compareSrc->m_type;
  compareSrc1 = GetMissingItemOpndForCompare(compareSrc->m_type,this->m_func);
  IVar1 = compareSrc->m_type;
  if ((IVar1 != TyInt32) && (IVar1 != TyVar)) {
    if (IVar1 == TyFloat64) {
      OVar3 = IR::Opnd::GetKind(compareSrc);
      if (OVar3 != OpndKindReg) {
        OVar3 = IR::Opnd::GetKind(compareSrc);
        if (OVar3 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x465c,"(compareSrc->IsRegOpnd() || compareSrc->IsIndirOpnd())",
                             "compareSrc->IsRegOpnd() || compareSrc->IsIndirOpnd()");
          if (!bVar4) goto LAB_005d7987;
          *puVar5 = 0;
        }
      }
      pBVar6 = LowererMD::InsertMissingItemCompareBranch
                         (&this->m_lowererMD,compareSrc,compareSrc1,opcode,target,insertBeforeInstr)
      ;
      return pBVar6;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
    ;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4661,"(compareSrc->IsInt32() || compareSrc->IsVar())",
                       "compareSrc->IsInt32() || compareSrc->IsVar()");
    if (!bVar4) {
LAB_005d7987:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pBVar6 = InsertCompareBranch((Lowerer *)this_00,compareSrc1,compareSrc,opcode,false,target,
                               insertBeforeInstr,true);
  return pBVar6;
}

Assistant:

IR::BranchInstr*
Lowerer::InsertMissingItemCompareBranch(IR::Opnd* compareSrc, Js::OpCode opcode, IR::LabelInstr* target, IR::Instr* insertBeforeInstr)
{
    IR::Opnd* missingItemOpnd = GetMissingItemOpndForCompare(compareSrc->GetType(), m_func);
    if (compareSrc->IsFloat64())
    {
        Assert(compareSrc->IsRegOpnd() || compareSrc->IsIndirOpnd());
        return m_lowererMD.InsertMissingItemCompareBranch(compareSrc, missingItemOpnd, opcode, target, insertBeforeInstr);
    }
    else
    {
        Assert(compareSrc->IsInt32() || compareSrc->IsVar());
        return InsertCompareBranch(missingItemOpnd, compareSrc, opcode, target, insertBeforeInstr, true);
    }
}